

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.h
# Opt level: O0

void __thiscall CVmFormatter::push_color(CVmFormatter *this)

{
  long lVar1;
  undefined8 *puVar2;
  long in_RDI;
  
  if (*(long *)(in_RDI + 0xef78) == 0x19) {
    memmove((void *)(in_RDI + 0xed20),(void *)(in_RDI + 0xed38),0x240);
    *(long *)(in_RDI + 0xef78) = *(long *)(in_RDI + 0xef78) + -1;
  }
  lVar1 = *(long *)(in_RDI + 0xef78);
  *(long *)(in_RDI + 0xef78) = lVar1 + 1;
  puVar2 = (undefined8 *)(in_RDI + 0xed20 + lVar1 * 0x18);
  *puVar2 = *(undefined8 *)(in_RDI + 0xecf0);
  puVar2[1] = *(undefined8 *)(in_RDI + 0xecf8);
  puVar2[2] = *(undefined8 *)(in_RDI + 0xed00);
  return;
}

Assistant:

void push_color()
    {
        /* 
         *   add a level to the color stack, if possible; if it's not
         *   possible, assume we've lost an end tag somewhere, so rotate the
         *   entire stack down a level 
         */
        if (color_sp_ == CVFMT_CLRSTK_MAX)
        {
            /* take everything down a level */
            memmove(color_stack_, color_stack_ + 1,
                    (CVFMT_CLRSTK_MAX - 1)*sizeof(color_stack_[0]));
            --color_sp_;
        }

        /* save the current color in the stack */
        color_stack_[color_sp_++] = cur_color_;
    }